

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

QString * __thiscall QTabBar::tabWhatsThis(QString *__return_storage_ptr__,QTabBar *this,int index)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((ulong)(long)index < *(ulong *)(lVar1 + 0x2e8)) &&
     (lVar1 = *(long *)(*(long *)(lVar1 + 0x2e0) + (long)index * 8), lVar1 != 0)) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)(lVar1 + 0x30));
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTabBar::tabWhatsThis(int index) const
{
    Q_D(const QTabBar);
    if (const QTabBarPrivate::Tab *tab = d->at(index))
        return tab->whatsThis;
    return QString();
}